

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_goto(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  ROOM_INDEX_DATA *room;
  CHAR_DATA **ppCVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (*argument == '\0') {
    pcVar6 = "Goto where?\n\r";
    goto LAB_002c5a0f;
  }
  room = find_location(ch,argument);
  if (room == (ROOM_INDEX_DATA *)0x0) {
    pcVar6 = "No such location.\n\r";
    goto LAB_002c5a0f;
  }
  uVar5 = 0;
  for (ppCVar4 = &room->people; *ppCVar4 != (CHAR_DATA *)0x0; ppCVar4 = &(*ppCVar4)->next_in_room) {
    uVar5 = uVar5 + 1;
  }
  bVar2 = is_room_owner(ch,room);
  if (bVar2) {
LAB_002c5841:
    if ((room->room_flags[0] & 0x4000) == 0) {
LAB_002c5870:
      if (ch->fighting != (CHAR_DATA *)0x0) {
        stop_fighting(ch,true);
      }
      ppCVar4 = &ch->in_room->people;
      while (pCVar1 = *ppCVar4, pCVar1 != (CHAR_DATA *)0x0) {
        iVar3 = get_trust(pCVar1);
        if (ch->invis_level <= iVar3) {
          iVar3 = get_trust(pCVar1);
          if ((iVar3 == 0x33) && (ch->invis_level == 0x33)) {
            bVar2 = is_heroimm(pCVar1);
            if (!bVar2) goto LAB_002c5914;
          }
          if ((ch->pcdata == (PC_DATA *)0x0) || (*ch->pcdata->bamfout == '\0')) {
LAB_002c5901:
            pcVar6 = (char *)0x0;
            pcVar7 = "$n leaves in a swirling mist.";
          }
          else {
            bVar2 = is_switched(ch);
            if (bVar2) goto LAB_002c5901;
            pcVar6 = ch->pcdata->bamfout;
            pcVar7 = "$t";
          }
          act(pcVar7,ch,pcVar6,pCVar1,2);
        }
LAB_002c5914:
        ppCVar4 = &pCVar1->next_in_room;
      }
      char_from_room(ch);
      char_to_room(ch,room);
      ppCVar4 = &ch->in_room->people;
      do {
        pCVar1 = *ppCVar4;
        if (pCVar1 == (CHAR_DATA *)0x0) {
          do_look(ch,"auto");
          return;
        }
        iVar3 = get_trust(pCVar1);
        if (ch->invis_level <= iVar3) {
          iVar3 = get_trust(pCVar1);
          if ((iVar3 == 0x33) && (ch->invis_level == 0x33)) {
            bVar2 = is_heroimm(pCVar1);
            if (!bVar2) goto LAB_002c59d2;
          }
          if ((ch->pcdata == (PC_DATA *)0x0) || (*ch->pcdata->bamfin == '\0')) {
LAB_002c59bf:
            pcVar6 = (char *)0x0;
            pcVar7 = "$n appears in a swirling mist.";
          }
          else {
            bVar2 = is_switched(ch);
            if (bVar2) goto LAB_002c59bf;
            pcVar6 = ch->pcdata->bamfin;
            pcVar7 = "$t";
          }
          act(pcVar7,ch,pcVar6,pCVar1,2);
        }
LAB_002c59d2:
        ppCVar4 = &pCVar1->next_in_room;
      } while( true );
    }
    iVar3 = get_trust(ch);
    if (0x3b < iVar3) goto LAB_002c5870;
  }
  else {
    bVar2 = room_is_private(room);
    if ((!bVar2) || ((uVar5 < 2 && (0x3b < ch->level)))) goto LAB_002c5841;
  }
  pcVar6 = "Access denied.\n\r";
LAB_002c5a0f:
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void do_goto(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *location;
	CHAR_DATA *rch;
	int count = 0;

	if (argument[0] == '\0')
	{
		send_to_char("Goto where?\n\r", ch);
		return;
	}

	location = find_location(ch, argument);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	count = 0;

	for (rch = location->people; rch != nullptr; rch = rch->next_in_room)
	{
		count++;
	}

	if (!is_room_owner(ch, location) && room_is_private(location) && (count > 1 || ch->level < MAX_LEVEL))
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (IS_SET(location->room_flags, ROOM_IMP_ONLY) && get_trust(ch) < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
		stop_fighting(ch, true);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (get_trust(rch) == LEVEL_HERO && ch->invis_level == LEVEL_HERO && !is_heroimm(rch))
				continue;

			if (ch->pcdata != nullptr && ch->pcdata->bamfout[0] != '\0' && !is_switched(ch))
				act("$t", ch, ch->pcdata->bamfout, rch, TO_VICT);
			else
				act("$n leaves in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	char_from_room(ch);
	char_to_room(ch, location);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (get_trust(rch) == LEVEL_HERO && ch->invis_level == LEVEL_HERO && !is_heroimm(rch))
				continue;

			if (ch->pcdata != nullptr && ch->pcdata->bamfin[0] != '\0' && !is_switched(ch))
				act("$t", ch, ch->pcdata->bamfin, rch, TO_VICT);
			else
				act("$n appears in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	do_look(ch, "auto");
}